

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

word * __thiscall capnp::_::WirePointer::farTarget(WirePointer *this,SegmentBuilder *segment)

{
  Fault this_00;
  Kind KVar1;
  uint uVar2;
  word *pwVar3;
  Fault local_20;
  Fault f;
  SegmentBuilder *segment_local;
  WirePointer *this_local;
  
  f.exception = (Exception *)segment;
  KVar1 = kind(this);
  this_00.exception = f.exception;
  if (KVar1 == FAR) {
    uVar2 = DirectWireValue<unsigned_int>::get(&this->offsetAndKind);
    uVar2 = bounded<unsigned_int>(uVar2);
    pwVar3 = SegmentBuilder::getPtrUnchecked((SegmentBuilder *)this_00.exception,uVar2 >> 3);
    return pwVar3;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0xd1,FAILED,"kind() == FAR","\"farTarget() should only be called on FAR pointers.\"",
             (char (*) [51])"farTarget() should only be called on FAR pointers.");
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

KJ_ALWAYS_INLINE(word* farTarget(SegmentBuilder* segment) const) {
    KJ_DREQUIRE(kind() == FAR,
        "farTarget() should only be called on FAR pointers.");
    return segment->getPtrUnchecked((bounded(offsetAndKind.get()) >> G(3)) * WORDS);
  }